

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_gentm.cc
# Opt level: O0

ASN1_GENERALIZEDTIME *
ASN1_GENERALIZEDTIME_adj(ASN1_GENERALIZEDTIME *s,time_t t,int offset_day,long offset_sec)

{
  bool bVar1;
  int iVar2;
  size_t len_s;
  int free_s;
  int ret;
  char buf [16];
  tm data;
  long offset_sec_local;
  int offset_day_local;
  int64_t posix_time_local;
  ASN1_GENERALIZEDTIME *s_local;
  
  iVar2 = OPENSSL_posix_to_tm(t,(tm *)(buf + 8));
  if (iVar2 == 0) {
    s_local = (ASN1_GENERALIZEDTIME *)0x0;
  }
  else if (((offset_day == 0) && (offset_sec == 0)) ||
          (iVar2 = OPENSSL_gmtime_adj((tm *)(buf + 8),offset_day,offset_sec), iVar2 != 0)) {
    if ((data.tm_mday < -0x76c) || (0x1fa3 < data.tm_mday)) {
      ERR_put_error(0xc,0,0x8a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_gentm.cc"
                    ,0x51);
      s_local = (ASN1_GENERALIZEDTIME *)0x0;
    }
    else {
      iVar2 = snprintf((char *)&free_s,0x10,"%04d%02d%02d%02d%02d%02dZ",
                       (ulong)(data.tm_mday + 0x76c),(ulong)(data.tm_hour + 1),
                       (ulong)(uint)data.tm_min,data.tm_sec,buf._12_4_,buf._8_4_);
      if (iVar2 != 0xf) {
        abort();
      }
      bVar1 = false;
      posix_time_local = (int64_t)s;
      if (s == (ASN1_GENERALIZEDTIME *)0x0) {
        bVar1 = true;
        posix_time_local = (int64_t)ASN1_UTCTIME_new();
        if ((ASN1_UTCTIME *)posix_time_local == (ASN1_UTCTIME *)0x0) {
          return (ASN1_GENERALIZEDTIME *)0x0;
        }
      }
      len_s = strlen((char *)&free_s);
      iVar2 = ASN1_STRING_set((ASN1_STRING *)posix_time_local,&free_s,len_s);
      if (iVar2 == 0) {
        if (bVar1) {
          ASN1_UTCTIME_free((ASN1_UTCTIME *)posix_time_local);
        }
        s_local = (ASN1_GENERALIZEDTIME *)0x0;
      }
      else {
        *(undefined4 *)(posix_time_local + 4) = 0x18;
        s_local = (ASN1_GENERALIZEDTIME *)posix_time_local;
      }
    }
  }
  else {
    s_local = (ASN1_GENERALIZEDTIME *)0x0;
  }
  return (ASN1_GENERALIZEDTIME *)s_local;
}

Assistant:

ASN1_GENERALIZEDTIME *ASN1_GENERALIZEDTIME_adj(ASN1_GENERALIZEDTIME *s,
                                               int64_t posix_time,
                                               int offset_day,
                                               long offset_sec) {
  struct tm data;
  if (!OPENSSL_posix_to_tm(posix_time, &data)) {
    return NULL;
  }

  if (offset_day || offset_sec) {
    if (!OPENSSL_gmtime_adj(&data, offset_day, offset_sec)) {
      return NULL;
    }
  }

  if (data.tm_year < 0 - 1900 || data.tm_year > 9999 - 1900) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TIME_VALUE);
    return NULL;
  }

  char buf[16];
  int ret = snprintf(buf, sizeof(buf), "%04d%02d%02d%02d%02d%02dZ",
                     data.tm_year + 1900, data.tm_mon + 1, data.tm_mday,
                     data.tm_hour, data.tm_min, data.tm_sec);
  // |snprintf| must write exactly 15 bytes (plus the NUL) to the buffer.
  BSSL_CHECK(ret == static_cast<int>(sizeof(buf) - 1));

  int free_s = 0;
  if (s == NULL) {
    free_s = 1;
    s = ASN1_UTCTIME_new();
    if (s == NULL) {
      return NULL;
    }
  }

  if (!ASN1_STRING_set(s, buf, strlen(buf))) {
    if (free_s) {
      ASN1_UTCTIME_free(s);
    }
    return NULL;
  }
  s->type = V_ASN1_GENERALIZEDTIME;
  return s;
}